

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,char *value)

{
  int32 iVar1;
  int iVar2;
  size_t value_00;
  
  if (value == (char *)0x0 || writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar1 = WriteID(writer,type);
  if (iVar1 == 0) {
    value_00 = strlen(value);
    iVar1 = WriteUInt(writer,value_00);
    if (iVar1 == 0) {
      iVar2 = (**writer->_vptr_IMkvWriter)(writer,value,value_00 & 0xffffffff);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const char* value) {
  if (!writer || !value)
    return false;

  if (WriteID(writer, type))
    return false;

  const uint64 length = strlen(value);
  if (WriteUInt(writer, length))
    return false;

  if (writer->Write(value, static_cast<uint32>(length)))
    return false;

  return true;
}